

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCodeGenerator.cpp
# Opt level: O1

void __thiscall
NativeCodeGenerator::CodeGen
          (NativeCodeGenerator *this,PageAllocator *pageAllocator,CodeGenWorkItem *workItem,
          bool foreground)

{
  undefined1 *puVar1;
  long *plVar2;
  int *piVar3;
  byte bVar4;
  FunctionBody *this_00;
  EntryPointInfo *epInfo;
  EntryPointInfo *pEVar5;
  SListCounted<Js::ConstructorCache_*,_Memory::Recycler> *pSVar6;
  FunctionBody *pFVar7;
  undefined1 auVar8 [16];
  code *pcVar9;
  bool bVar10;
  uint16 uVar11;
  int iVar12;
  uint sourceContextId;
  UINT_PTR UVar13;
  ScriptContext *pSVar14;
  FunctionJITTimeDataIDL *pFVar15;
  FunctionCodeGenJitTimeData *pFVar16;
  JavascriptMethod p_Var17;
  Var pvVar18;
  NativeEntryPointData *pNVar19;
  undefined4 *puVar20;
  JitTransferData *pJVar21;
  HeapAllocator *alloc_00;
  XDataAllocation *xdataInfo;
  DynamicProfileInfo *pDVar22;
  ptrdiff_t pVar23;
  long lVar24;
  JobProcessor *this_01;
  undefined8 uVar25;
  uint uVar26;
  undefined7 in_register_00000009;
  undefined **ppuVar27;
  ThreadContextInfo *this_02;
  LoopEntryPointInfo *entryPoint;
  Type *addr;
  Type *addr_00;
  undefined1 local_180 [8];
  TrackAllocData data;
  ArenaAllocator alloc;
  JITOutputIDL jitWriteData;
  LARGE_INTEGER start_time;
  
  if ((int)CONCAT71(in_register_00000009,foreground) == 0) {
    bVar10 = Js::ConfigFlagsTable::IsEnabled
                       ((ConfigFlagsTable *)&Js::Configuration::Global,InduceCodeGenFailureFlag);
    if (!bVar10) goto LAB_005ff3d9;
    if ((CodegenFailureSeed == 0) &&
       (CodegenFailureSeed = (UINT_PTR)DAT_015b5fc4, CodegenFailureSeed == 0)) {
      QueryPerformanceCounter
                ((LARGE_INTEGER *)
                 &alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  freeList);
      CodegenFailureSeed =
           (UINT_PTR)
           ((uint)alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  freeList ^
           alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
           _4_4_);
      srand((uint)alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  freeList ^
            alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
            _4_4_);
    }
    UVar13 = Math::Rand();
    auVar8._8_8_ = 0;
    auVar8._0_8_ = UVar13 >> 2;
    uVar26 = (int)UVar13 + (SUB164(auVar8 * ZEXT816(0x28f5c28f5c28f5c3),8) >> 2) * -100;
    if (DAT_015b5fc0 <= (int)uVar26) goto LAB_005ff3d9;
    uVar26 = uVar26 % 3;
    if (uVar26 != 2) {
      if (uVar26 != 1) {
        Js::Throw::OutOfMemory();
      }
      uVar25 = __cxa_allocate_exception(1);
      ppuVar27 = &Js::StackOverflowException::typeinfo;
      goto LAB_005ffc4e;
    }
  }
  else {
    ThreadContext::ProbeStackNoDispose
              (this->scriptContext->threadContext,0xc000,this->scriptContext,(PVOID)0x0);
LAB_005ff3d9:
    if ((workItem->jitData).type == '\0') {
      p_Var17 = Js::FunctionProxy::GetDirectEntryPoint
                          ((FunctionProxy *)workItem->functionBody,
                           &workItem->entryPointInfo->super_ProxyEntryPointInfo);
      if (p_Var17 != CheckCodeGenThunk) {
        p_Var17 = Js::FunctionProxy::GetDirectEntryPoint
                            ((FunctionProxy *)workItem->functionBody,
                             &workItem->entryPointInfo->super_ProxyEntryPointInfo);
        if (p_Var17 != CheckAsmJsCodeGenThunk) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                              ,0x3be,
                              "(workItem->Type() != JsFunctionType || irviewerInstance || IsThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())) || IsAsmJsCodeGenThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())))"
                              ,
                              "workItem->Type() != JsFunctionType || irviewerInstance || IsThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())) || IsAsmJsCodeGenThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint()))"
                             );
          if (!bVar10) goto LAB_005ffc0a;
          *puVar20 = 0;
        }
      }
    }
    iVar12 = (**workItem->_vptr_CodeGenWorkItem)(workItem);
    LOCK();
    this->byteCodeSizeGenerated = this->byteCodeSizeGenerated + iVar12;
    UNLOCK();
    this_00 = workItem->functionBody;
    Js::FunctionBody::GetLocalsCount(this_00);
    pSVar14 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
    iVar12 = (*(pSVar14->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])(pSVar14);
    if ((char)iVar12 == '\0') {
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::ArenaAllocatorBase
                ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)&data.line,
                 L"JitData",pageAllocator,Js::Throw::OutOfMemory,
                 JsUtil::ExternalApi::RecoverUnusedMemory);
      pFVar15 = (FunctionJITTimeDataIDL *)
                new<Memory::ArenaAllocator>(0xa8,(ArenaAllocator *)&data.line,0x36904a);
      (workItem->jitData).jitData = pFVar15;
      pFVar16 = Js::CodeGenRecyclableData::JitTimeData(workItem->recyclableData);
      FunctionJITTimeInfo::BuildJITTimeData
                ((ArenaAllocator *)&data.line,pFVar16,(FunctionCodeGenRuntimeData *)0x0,
                 (workItem->jitData).jitData,false,foreground);
      uVar11 = Js::FunctionCodeGenJitTimeData::GetProfiledIterations(pFVar16);
      (workItem->jitData).profiledIterations = uVar11;
      epInfo = workItem->entryPointInfo;
      if ((workItem->jitData).type == '\0') {
        ((workItem->jitData).jitData)->callsCountAddress = (long)&epInfo[1].field_0x1c;
      }
      else {
        (workItem->jitData).jittedLoopIterationsSinceLastBailoutAddr =
             (long)&epInfo[1].super_ProxyEntryPointInfo.super_ExpirableObject.registrationHandle;
      }
      ((workItem->jitData).jitData)->sharedPropertyGuards = (pFVar16->sharedPropertyGuards).ptr;
      ((workItem->jitData).jitData)->sharedPropGuardCount = pFVar16->sharedPropertyGuardCount;
      memset(&alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
              freeList,0,0x90);
      pFVar16 = Js::CodeGenRecyclableData::JitTimeData(workItem->recyclableData);
      pvVar18 = Js::FunctionCodeGenJitTimeData::GetGlobalThisObject(pFVar16);
      (workItem->jitData).globalThisAddr = (long)pvVar18;
      jitWriteData.startTime = 0;
      LogCodeGenStart(workItem,(LARGE_INTEGER *)&jitWriteData.startTime);
      (workItem->jitData).startTime = jitWriteData.startTime;
      CodeGen(this,pageAllocator,&workItem->jitData,
              (JITOutputIDL *)
              &alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
               freeList,foreground,epInfo);
      pNVar19 = Js::EntryPointInfo::GetNativeEntryPointData(epInfo);
      pNVar19->frameHeight = jitWriteData.localVarSlotsOffset;
      if ((workItem->jitData).type == '\0') {
        pEVar5 = workItem->entryPointInfo;
        *(undefined4 *)&pEVar5[1].super_ProxyEntryPointInfo.jsMethod = jitWriteData._12_4_;
        *(undefined4 *)((long)&pEVar5[1].super_ProxyEntryPointInfo.jsMethod + 4) =
             jitWriteData._16_4_;
      }
      if (jitWriteData.disableInlineApply != '\0') {
        puVar1 = &workItem->entryPointInfo->field_0x18;
        *puVar1 = *puVar1 | 4;
      }
      if ((workItem->jitData).jitMode == '\x03') {
        if (jitWriteData.ctorCacheEntries != (CtorCacheTransferEntryIDL **)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                              ,0x46d,"(jitWriteData.pinnedTypeRefs == nullptr)",
                              "jitWriteData.pinnedTypeRefs == nullptr");
          if (!bVar10) goto LAB_005ffc0a;
          *puVar20 = 0;
        }
      }
      else {
        pJVar21 = Js::EntryPointInfo::GetJitTransferData(epInfo);
        addr_00 = &pJVar21->runtimeTypeRefs;
        Memory::Recycler::WBSetBit((char *)addr_00);
        addr_00->ptr = (PinnedTypeRefsIDL *)jitWriteData.ctorCacheEntries;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(addr_00);
        pJVar21 = Js::EntryPointInfo::GetJitTransferData(epInfo);
        pJVar21->equivalentTypeGuardOffsets = (Type)jitWriteData.buffer;
        pJVar21 = Js::EntryPointInfo::GetJitTransferData(epInfo);
        (pJVar21->typeGuardTransferData).entries = (Type)jitWriteData.thunkAddress;
        (pJVar21->typeGuardTransferData).propertyGuardCount =
             jitWriteData.inlineeFrameOffsetArrayOffset;
        if (jitWriteData.typeGuardEntries != (TypeGuardTransferEntryIDL *)0x0) {
          pNVar19 = Js::EntryPointInfo::GetNativeEntryPointData(epInfo);
          pSVar6 = (pNVar19->constructorCaches).ptr;
          if ((pSVar6 == (SListCounted<Js::ConstructorCache_*,_Memory::Recycler> *)0x0) ||
             ((pSVar6->super_SList<Js::ConstructorCache_*,_Memory::Recycler,_RealCount>).
              super_SListBase<Js::ConstructorCache_*,_Memory::Recycler,_RealCount>.super_RealCount.
              count == 0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar20 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                                ,0x466,
                                "(jitWriteData.ctorCacheEntries == nullptr || epInfo->GetNativeEntryPointData()->GetConstructorCacheCount() > 0)"
                                ,
                                "jitWriteData.ctorCacheEntries == nullptr || epInfo->GetNativeEntryPointData()->GetConstructorCacheCount() > 0"
                               );
            if (!bVar10) goto LAB_005ffc0a;
            *puVar20 = 0;
          }
        }
        pJVar21 = Js::EntryPointInfo::GetJitTransferData(epInfo);
        (pJVar21->ctorCacheTransferData).entries = (Type)jitWriteData.typeGuardEntries;
        (pJVar21->ctorCacheTransferData).ctorCachesCount = jitWriteData.inlineeFrameOffsetArrayCount
        ;
        pJVar21 = Js::EntryPointInfo::GetJitTransferData(workItem->entryPointInfo);
        pJVar21->isReady = true;
      }
      local_180 = (undefined1  [8])&Memory::XDataAllocation::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_1bf4588;
      data.filename._0_4_ = 0x472;
      alloc_00 = Memory::HeapAllocator::TrackAllocInfo
                           (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_180);
      xdataInfo = (XDataAllocation *)new<Memory::HeapAllocator>(8,alloc_00,0x392910);
      (xdataInfo->super_SecondaryAllocation).address = (BYTE *)0x0;
      (xdataInfo->super_SecondaryAllocation).address = (BYTE *)jitWriteData._56_8_;
      Memory::XDataAllocator::Register
                (xdataInfo,jitWriteData.xdataAddr,jitWriteData.localVarChangedOffset);
      pNVar19 = Js::EntryPointInfo::GetNativeEntryPointData(epInfo);
      addr = &pNVar19->xdataInfo;
      Memory::Recycler::WBSetBit((char *)addr);
      addr->ptr = xdataInfo;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
      if (DAT_015bbe80 == '\0') {
        this_02 = &this->scriptContext->threadContext->super_ThreadContextInfo;
        if (jitWriteData.codeAddress == 0) {
          ThreadContextInfo::SetValidCallTargetForCFG(this_02,(PVOID)jitWriteData.xdataAddr,true);
        }
        else {
          ThreadContextInfo::SetValidCallTargetForCFG(this_02,(PVOID)jitWriteData.codeAddress,true);
        }
      }
      if ((workItem->jitData).type == '\x01') {
        if (jitWriteData.codeAddress != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar20 = 1;
          bVar10 = Js::Throw::ReportAssert
                             ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                              ,0x4a6,"(jitWriteData.thunkAddress == __null)",
                              "jitWriteData.thunkAddress == NULL");
          if (!bVar10) goto LAB_005ffc0a;
          *puVar20 = 0;
        }
        workItem[1]._vptr_CodeGenWorkItem = (_func_int **)jitWriteData.xdataAddr;
      }
      Js::EntryPointInfo::SetCodeGenRecorded
                (workItem->entryPointInfo,(JavascriptMethod)jitWriteData.codeAddress,
                 (JavascriptMethod)jitWriteData.xdataAddr,
                 (ulong)(uint)jitWriteData.localVarChangedOffset,this);
      sourceContextId =
           Js::FunctionProxy::GetSourceContextId((FunctionProxy *)workItem->functionBody);
      pFVar7 = workItem->functionBody;
      if ((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr ==
          (FunctionInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                            ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
        if (!bVar10) {
LAB_005ffc0a:
          pcVar9 = (code *)invalidInstructionException();
          (*pcVar9)();
        }
        *puVar20 = 0;
      }
      bVar10 = Js::Phases::IsEnabled
                         ((Phases *)&DAT_015ad2f8,EncoderPhase,sourceContextId,
                          ((pFVar7->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.
                          ptr)->functionId);
      if ((bVar10) && (DAT_015d346a == '\x01')) {
        Js::EntryPointInfo::DumpNativeOffsetMaps(workItem->entryPointInfo);
        Js::EntryPointInfo::DumpNativeThrowSpanSequence(workItem->entryPointInfo);
        Output::Flush();
      }
      if (jitWriteData.disableAggressiveIntTypeSpec != '\0') {
        this_00->field_0x178 = this_00->field_0x178 | 0x40;
      }
      if (jitWriteData.disableArrayCheckHoist == '\0') {
        ThreadContextInfo::ResetIsAllJITCodeInPreReservedRegion
                  (&this->scriptContext->threadContext->super_ThreadContextInfo);
      }
      this_00->m_argUsedForBranch = this_00->m_argUsedForBranch | jitWriteData._8_2_;
      if ((this_00->dynamicProfileInfo).ptr != (DynamicProfileInfo *)0x0) {
        if ((char)alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                  freeList != '\0') {
          pDVar22 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
          *(uint *)&pDVar22->bits =
               (uint)((workItem->jitData).type != '\x01') << 0xb | *(uint *)&pDVar22->bits | 0x1000;
        }
        if (alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
            _1_1_ != '\0') {
          pDVar22 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
          *(uint *)&pDVar22->bits = *(uint *)&pDVar22->bits | (workItem->jitData).type == '\x01' ^ 3
          ;
        }
        if (alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
            _4_1_ != '\0') {
          pDVar22 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
          puVar1 = &(pDVar22->bits).field_0x4;
          *puVar1 = *puVar1 | 8;
        }
        if (alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
            _5_1_ != '\0') {
          pDVar22 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
          puVar1 = &(pDVar22->bits).field_0x3;
          *puVar1 = *puVar1 | 0x40;
        }
        if (alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
            _6_1_ != '\0') {
          pDVar22 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
          puVar1 = &(pDVar22->bits).field_0x1;
          *puVar1 = *puVar1 | 1;
        }
        if (alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
            _7_1_ != '\0') {
          pDVar22 = Js::FunctionBody::GetAnyDynamicProfileInfo(this_00);
          *(byte *)&pDVar22->bits = *(byte *)&pDVar22->bits | 0x80;
        }
      }
      if (alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
          _2_1_ != '\0') {
        Js::FunctionBody::SetDisableInlineApply(this_00,true);
      }
      if (alloc.super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.freeList.
          _3_1_ != '\0') {
        this_00->field_0x179 = this_00->field_0x179 | 0x20;
      }
      if (DAT_015c7943 == '\x01') {
        pVar23 = Js::EntryPointInfo::GetCodeSize(workItem->entryPointInfo);
        plVar2 = &this->scriptContext->codeSize;
        *plVar2 = *plVar2 + pVar23;
      }
      LogCodeGenDone(workItem,(LARGE_INTEGER *)&jitWriteData.startTime);
      pSVar14 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)workItem->functionBody);
      bVar4 = (workItem->jitData).type;
      if (bVar4 == '\x01') {
        lVar24 = 0x116c;
      }
      else {
        if (bVar4 != '\0') goto LAB_005ffb6b;
        iVar12 = (**workItem->_vptr_CodeGenWorkItem)(workItem);
        LOCK();
        pSVar14->bytecodeJITCount = pSVar14->bytecodeJITCount + iVar12;
        UNLOCK();
        lVar24 = 0x1168;
      }
      LOCK();
      piVar3 = (int *)((long)&(pSVar14->super_ScriptContextInfo)._vptr_ScriptContextInfo + lVar24);
      *piVar3 = *piVar3 + 1;
      UNLOCK();
LAB_005ffb6b:
      Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
      ~ArenaAllocatorBase((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          &data.line);
      return;
    }
    this_01 = JsUtil::JobManager::Processor((JobManager *)this);
    bVar10 = JsUtil::JobProcessor::ProcessesInBackground(this_01);
    if (!bVar10) {
      pSVar14 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this_00);
      if (pSVar14->isScriptContextActuallyClosed == true) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar20 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/NativeCodeGenerator.cpp"
                            ,0x3c8,
                            "(IsBackgroundJIT() || !body->GetScriptContext()->IsActuallyClosed())",
                            "IsBackgroundJIT() || !body->GetScriptContext()->IsActuallyClosed()");
        if (!bVar10) goto LAB_005ffc0a;
        *puVar20 = 0;
      }
    }
  }
  uVar25 = __cxa_allocate_exception(1);
  ppuVar27 = &Js::OperationAbortedException::typeinfo;
LAB_005ffc4e:
  __cxa_throw(uVar25,ppuVar27,0);
}

Assistant:

void
NativeCodeGenerator::CodeGen(PageAllocator * pageAllocator, CodeGenWorkItem* workItem, const bool foreground)
{
    if(foreground)
    {
        // Func::Codegen has a lot of things on the stack, so probe the stack here instead
        PROBE_STACK_NO_DISPOSE(scriptContext, Js::Constants::MinStackJITCompile);
    }

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (!foreground && Js::Configuration::Global.flags.IsEnabled(Js::InduceCodeGenFailureFlag))
    {
        if (NativeCodeGenerator::CodegenFailureSeed == 0)
        {
            // Initialize the seed
            NativeCodeGenerator::CodegenFailureSeed = Js::Configuration::Global.flags.InduceCodeGenFailureSeed;
            if (NativeCodeGenerator::CodegenFailureSeed == 0)
            {
                LARGE_INTEGER ctr;
                ::QueryPerformanceCounter(&ctr);

                NativeCodeGenerator::CodegenFailureSeed = ctr.HighPart ^ ctr.LowPart;
                srand((uint)NativeCodeGenerator::CodegenFailureSeed);
            }
        }

        int v = Math::Rand() % 100;
        if (v < Js::Configuration::Global.flags.InduceCodeGenFailure)
        {
            switch (v % 3)
            {
            case 0: Js::Throw::OutOfMemory(); break;
            case 1: throw Js::StackOverflowException(); break;
            case 2: throw Js::OperationAbortedException(); break;
            default:
                Assert(false);
            }
        }
    }
#endif

    bool irviewerInstance = false;
#ifdef IR_VIEWER
    irviewerInstance = true;
#endif
    Assert(
        workItem->Type() != JsFunctionType ||
        irviewerInstance ||
        IsThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())) ||
        IsAsmJsCodeGenThunk(workItem->GetFunctionBody()->GetDirectEntryPoint(workItem->GetEntryPoint())));

    InterlockedExchangeAdd(&this->byteCodeSizeGenerated, workItem->GetByteCodeCount()); // must be interlocked because this data may be modified in the foreground and background thread concurrently
    Js::FunctionBody* body = workItem->GetFunctionBody();
    int nRegs = body->GetLocalsCount();
    AssertMsg((nRegs + 1) == (int)(SymID)(nRegs + 1), "SymID too small...");

    if (body->GetScriptContext()->IsClosed())
    {
        // Should not be jitting something in the foreground when the script context is actually closed
        Assert(IsBackgroundJIT() || !body->GetScriptContext()->IsActuallyClosed());

        throw Js::OperationAbortedException();
    }

#if ENABLE_OOP_NATIVE_CODEGEN
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        workItem->GetJITData()->nativeDataAddr = (__int3264)workItem->GetEntryPoint()->GetOOPNativeEntryPointData()->GetNativeDataBufferRef();
    }
#endif

    // TODO: oop jit can we be more efficient here?
    ArenaAllocator alloc(_u("JitData"), pageAllocator, Js::Throw::OutOfMemory);

    auto& jitData = workItem->GetJITData()->jitData;
    jitData = AnewStructZ(&alloc, FunctionJITTimeDataIDL);
    auto codeGenData = workItem->RecyclableData()->JitTimeData();
    FunctionJITTimeInfo::BuildJITTimeData(&alloc, codeGenData, nullptr, workItem->GetJITData()->jitData, false, foreground);
    workItem->GetJITData()->profiledIterations = codeGenData->GetProfiledIterations();
    Js::EntryPointInfo * epInfo = workItem->GetEntryPoint();
    if (workItem->Type() == JsFunctionType)
    {
        auto funcEPInfo = (Js::FunctionEntryPointInfo*)epInfo;
        jitData->callsCountAddress = (uintptr_t)&funcEPInfo->callsCount;
    }
    else
    {
        workItem->GetJITData()->jittedLoopIterationsSinceLastBailoutAddr = (intptr_t)Js::FunctionBody::GetJittedLoopIterationsSinceLastBailoutAddress(epInfo);
    }

    jitData->sharedPropertyGuards = codeGenData->sharedPropertyGuards;
    jitData->sharedPropGuardCount = codeGenData->sharedPropertyGuardCount;

    JITOutputIDL jitWriteData = {0};

#if !FLOATVAR
    workItem->GetJITData()->xProcNumberPageSegment = scriptContext->GetThreadContext()->GetXProcNumberPageSegmentManager()->GetFreeSegment(&alloc);
#endif
    workItem->GetJITData()->globalThisAddr = (intptr_t)workItem->RecyclableData()->JitTimeData()->GetGlobalThisObject();

    LARGE_INTEGER start_time = { 0 };
    NativeCodeGenerator::LogCodeGenStart(workItem, &start_time);
    workItem->GetJITData()->startTime = (int64)start_time.QuadPart;
    CodeGen(pageAllocator, workItem->GetJITData(), jitWriteData, foreground, epInfo);

    if (JITManager::GetJITManager()->IsOOPJITEnabled() && PHASE_VERBOSE_TRACE(Js::BackEndPhase, workItem->GetFunctionBody()))
    {
        LARGE_INTEGER freq;
        LARGE_INTEGER end_time;
        QueryPerformanceCounter(&end_time);
        QueryPerformanceFrequency(&freq);

        Output::Print(
            _u("BackendMarshalOut - function: %s time:%8.6f mSec\r\n"),
            workItem->GetFunctionBody()->GetDisplayName(),
            (((double)((end_time.QuadPart - jitWriteData.startTime)* (double)1000.0 / (double)freq.QuadPart))) / (1));
        Output::Flush();
    }

    epInfo->GetNativeEntryPointData()->SetFrameHeight(jitWriteData.frameHeight);

    if (workItem->Type() == JsFunctionType)
    {
        Js::FunctionEntryPointInfo * funcEP = (Js::FunctionEntryPointInfo*)workItem->GetEntryPoint();
        funcEP->localVarSlotsOffset = jitWriteData.localVarSlotsOffset;
        funcEP->localVarChangedOffset = jitWriteData.localVarChangedOffset;
    }

    if (jitWriteData.hasJittedStackClosure != FALSE)
    {
        workItem->GetEntryPoint()->SetHasJittedStackClosure();
    }

#if ENABLE_OOP_NATIVE_CODEGEN
#if !FLOATVAR
    if (jitWriteData.numberPageSegments)
    {
        if (jitWriteData.numberPageSegments->pageAddress == 0)
        {
            midl_user_free(jitWriteData.numberPageSegments);
            jitWriteData.numberPageSegments = nullptr;
        }
        else
        {
            // TODO: when codegen fail, need to return the segment as well
            epInfo->GetOOPNativeEntryPointData()->SetNumberPageSegment(jitWriteData.numberPageSegments);
        }
    }
#endif
#endif

#if ENABLE_OOP_NATIVE_CODEGEN
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        if (jitWriteData.nativeDataFixupTable)
        {
            for (unsigned int i = 0; i < jitWriteData.nativeDataFixupTable->count; i++)
            {
                auto& record = jitWriteData.nativeDataFixupTable->fixupRecords[i];
                auto updateList = record.updateList;

                if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                {
                    Output::Print(_u("NativeCodeData Fixup: allocIndex:%d, len:%x, totalOffset:%x, startAddress:%p\n"),
                        record.index, record.length, record.startOffset, jitWriteData.buffer->data + record.startOffset);
                }

                while (updateList)
                {
                    void* addrToFixup = jitWriteData.buffer->data + record.startOffset + updateList->addrOffset;
                    void* targetAddr = jitWriteData.buffer->data + updateList->targetTotalOffset;

                    if (PHASE_TRACE1(Js::NativeCodeDataPhase))
                    {
                        Output::Print(_u("\tEntry: +%x %p(%p) ==> %p\n"), updateList->addrOffset, addrToFixup, *(void**)(addrToFixup), targetAddr);
                    }

                    *(void**)(addrToFixup) = targetAddr;
                    auto current = updateList;
                    updateList = updateList->next;
                    midl_user_free(current);
                }
            }
            midl_user_free(jitWriteData.nativeDataFixupTable);
            jitWriteData.nativeDataFixupTable = nullptr;

            // change the address with the fixup information
            epInfo->GetOOPNativeEntryPointData()->SetNativeDataBuffer((char*)jitWriteData.buffer->data);

#if DBG
            if (PHASE_TRACE1(Js::NativeCodeDataPhase))
            {
                Output::Print(_u("NativeCodeData Client Buffer: %p, len: %x\n"), jitWriteData.buffer->data, jitWriteData.buffer->len);
            }
#endif
        }

        if (jitWriteData.throwMapCount > 0)
        {
            Js::ThrowMapEntry * throwMap = (Js::ThrowMapEntry *)(jitWriteData.buffer->data + jitWriteData.throwMapOffset);
            Js::SmallSpanSequenceIter iter;
            for (uint i = 0; i < jitWriteData.throwMapCount; ++i)
            {
                workItem->RecordNativeThrowMap(iter, throwMap[i].nativeBufferOffset, throwMap[i].statementIndex);
            }
        }

        epInfo->GetOOPNativeEntryPointData()->RecordInlineeFrameOffsetsInfo(jitWriteData.inlineeFrameOffsetArrayOffset, jitWriteData.inlineeFrameOffsetArrayCount);
    }
#endif

    if (workItem->GetJitMode() != ExecutionMode::SimpleJit)
    {
        epInfo->GetJitTransferData()->SetRuntimeTypeRefs(jitWriteData.pinnedTypeRefs);
        epInfo->GetJitTransferData()->SetEquivalentTypeGuardOffsets(jitWriteData.equivalentTypeGuardOffsets);
        epInfo->GetJitTransferData()->SetTypeGuardTransferData(&jitWriteData);

        Assert(jitWriteData.ctorCacheEntries == nullptr || epInfo->GetNativeEntryPointData()->GetConstructorCacheCount() > 0);
        epInfo->GetJitTransferData()->SetCtorCacheTransferData(&jitWriteData);

        workItem->GetEntryPoint()->GetJitTransferData()->SetIsReady();
    }
    else
    {
        Assert(jitWriteData.pinnedTypeRefs == nullptr);
    }


#if defined(TARGET_64)
    XDataAllocation * xdataInfo = HeapNewZ(XDataAllocation);
    xdataInfo->address = (byte*)jitWriteData.xdataAddr;
    XDataAllocator::Register(xdataInfo, jitWriteData.codeAddress, jitWriteData.codeSize);
    epInfo->GetNativeEntryPointData()->SetXDataInfo(xdataInfo);
#endif


#if defined(_M_ARM)
    // for in-proc jit we do registration in encoder
    if (JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        XDataAllocation * xdataInfo = HeapNewZ(XDataAllocation);
        xdataInfo->pdataCount = jitWriteData.pdataCount;
        xdataInfo->xdataSize = jitWriteData.xdataSize;
        if (jitWriteData.buffer)
        {
            xdataInfo->address = jitWriteData.buffer->data + jitWriteData.xdataOffset;
            for (ushort i = 0; i < xdataInfo->pdataCount; ++i)
            {
                RUNTIME_FUNCTION *function = xdataInfo->GetPdataArray() + i;
                // if flag is 0, then we have separate .xdata, for which we need to fixup the address
                if (function->Flag == 0)
                {
                    // UnwindData was set on server as the offset from the beginning of xdata buffer
                    function->UnwindData = (DWORD)(xdataInfo->address + function->UnwindData);
                    Assert(((DWORD)function->UnwindData & 0x3) == 0); // 4 byte aligned
                }
            }
        }
        else
        {
            xdataInfo->address = nullptr;
        }
        // unmask thumb mode from code address
        XDataAllocator::Register(xdataInfo, jitWriteData.codeAddress & ~0x1, jitWriteData.codeSize);
        epInfo->GetNativeEntryPointData()->SetXDataInfo(xdataInfo);
    }
#endif

    if (!CONFIG_FLAG(OOPCFGRegistration))
    {
        if (jitWriteData.thunkAddress)
        {
            scriptContext->GetThreadContext()->SetValidCallTargetForCFG((PVOID)jitWriteData.thunkAddress);
        }
        else
        {
            scriptContext->GetThreadContext()->SetValidCallTargetForCFG((PVOID)jitWriteData.codeAddress);
        }
    }
    if (workItem->Type() == JsLoopBodyWorkItemType)
    {
        Assert(jitWriteData.thunkAddress == NULL);
        ((JsLoopBodyCodeGen*)workItem)->SetCodeAddress(jitWriteData.codeAddress);
    }

    workItem->GetEntryPoint()->SetCodeGenRecorded((Js::JavascriptMethod)jitWriteData.thunkAddress, (Js::JavascriptMethod)jitWriteData.codeAddress, jitWriteData.codeSize, (void *)this);

#if DBG_DUMP
    if (PHASE_DUMP(Js::EncoderPhase, workItem->GetFunctionBody()) && Js::Configuration::Global.flags.Verbose && !JITManager::GetJITManager()->IsOOPJITEnabled())
    {
        workItem->GetEntryPoint()->DumpNativeOffsetMaps();
        workItem->GetEntryPoint()->DumpNativeThrowSpanSequence();
        Output::Flush();
    }
#endif

    if (jitWriteData.hasBailoutInstr != FALSE)
    {
        body->SetHasBailoutInstrInJittedCode(true);
    }
    if (!jitWriteData.isInPrereservedRegion)
    {
        scriptContext->GetThreadContext()->ResetIsAllJITCodeInPreReservedRegion();
    }

    body->m_argUsedForBranch |= jitWriteData.argUsedForBranch;

    if (body->HasDynamicProfileInfo())
    {
        if (jitWriteData.disableArrayCheckHoist)
        {
            body->GetAnyDynamicProfileInfo()->DisableArrayCheckHoist(workItem->Type() == JsLoopBodyWorkItemType);
        }
        if (jitWriteData.disableAggressiveIntTypeSpec)
        {
            body->GetAnyDynamicProfileInfo()->DisableAggressiveIntTypeSpec(workItem->Type() == JsLoopBodyWorkItemType);
        }
        if (jitWriteData.disableStackArgOpt)
        {
            body->GetAnyDynamicProfileInfo()->DisableStackArgOpt();
        }
        if (jitWriteData.disableSwitchOpt)
        {
            body->GetAnyDynamicProfileInfo()->DisableSwitchOpt();
        }
        if (jitWriteData.disableTrackCompoundedIntOverflow)
        {
            body->GetAnyDynamicProfileInfo()->DisableTrackCompoundedIntOverflow();
        }
        if (jitWriteData.disableMemOp)
        {
            body->GetAnyDynamicProfileInfo()->DisableMemOp();
        }
    }

    if (jitWriteData.disableInlineApply)
    {
        body->SetDisableInlineApply(true);
    }
    if (jitWriteData.disableInlineSpread)
    {
        body->SetDisableInlineSpread(true);
    }

#ifdef PROFILE_BAILOUT_RECORD_MEMORY
    if (Js::Configuration::Global.flags.ProfileBailOutRecordMemory)
    {
        scriptContext->codeSize += workItem->GetEntryPoint()->GetCodeSize();
    }
#endif

    NativeCodeGenerator::LogCodeGenDone(workItem, &start_time);

#ifdef BGJIT_STATS
    // Must be interlocked because the following data may be modified from the background and foreground threads concurrently
    Js::ScriptContext *scriptContext = workItem->GetScriptContext();
    if (workItem->Type() == JsFunctionType)
    {
        InterlockedExchangeAdd(&scriptContext->bytecodeJITCount, workItem->GetByteCodeCount());
        InterlockedIncrement(&scriptContext->funcJITCount);
    }
    else if(workItem->Type() == JsLoopBodyWorkItemType)
    {
        InterlockedIncrement(&scriptContext->loopJITCount);
    }
#endif
}